

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gcfinal.c
# Opt level: O0

void printarrayblock(LispPTR base)

{
  LispPTR *pLVar1;
  LispPTR *pLVar2;
  LispPTR *pLVar3;
  LispPTR nbase;
  LispPTR pbase;
  LispPTR *addr;
  arrayblock *ptrailer;
  arrayblock *btrailer;
  arrayblock *bbase;
  LispPTR base_local;
  
  pLVar1 = NativeAligned4FromLAddr(base);
  pLVar2 = NativeAligned4FromLAddr(base + ((ushort)*pLVar1 - 1) * 2);
  pLVar3 = NativeAligned4FromLAddr(base - 2);
  printf("This array block: 0x%x.  Previous: 0x%x.  Next: 0x%x.\n",(ulong)base,
         (ulong)(base + (uint)(ushort)*pLVar3 * -2),(ulong)(base + (uint)(ushort)*pLVar1 * 2));
  printf("          Length: %d cells.\n\n",(ulong)(ushort)*pLVar1);
  for (_nbase = pLVar1 + -0x14; _nbase < pLVar1; _nbase = _nbase + 1) {
    printf("%16p %8x\n",_nbase,(ulong)*_nbase);
  }
  printf("%16p %8x <- array header\n",_nbase,(ulong)*_nbase);
  while (_nbase = _nbase + 1, _nbase < pLVar1 + 0x14) {
    printf("%16p %8x\n",_nbase,(ulong)*_nbase);
  }
  printf(". . .\n");
  for (_nbase = pLVar2 + -0x14; _nbase < pLVar2; _nbase = _nbase + 1) {
    printf("%16p %8x\n",_nbase,(ulong)*_nbase);
  }
  printf("%16p %8x <- array trailer\n",_nbase,(ulong)*_nbase);
  while (_nbase = _nbase + 1, _nbase < pLVar2 + 0x14) {
    printf("%16p %8x\n",_nbase,(ulong)*_nbase);
  }
  return;
}

Assistant:

void printarrayblock(LispPTR base) {
  struct arrayblock *bbase, *btrailer, *ptrailer;
  LispPTR *addr;

  LispPTR pbase, nbase;

  bbase = (struct arrayblock *)NativeAligned4FromLAddr(base);
  btrailer = (struct arrayblock *)NativeAligned4FromLAddr(Trailer(base, bbase));
  ptrailer = (struct arrayblock *)NativeAligned4FromLAddr(base - ARRAYBLOCKTRAILERWORDS);

  nbase = base + 2 * bbase->arlen;
  pbase = base - 2 * ptrailer->arlen;

  printf("This array block: 0x%x.  Previous: 0x%x.  Next: 0x%x.\n", base, pbase, nbase);
  printf("          Length: %d cells.\n\n", bbase->arlen);

  addr = ((LispPTR *)bbase) - 20;
  for (; addr < (LispPTR *)bbase; addr++) printf("%16p %8x\n", (void *)addr, *addr);
  printf("%16p %8x <- array header\n", (void *)addr, *addr);
  addr++;
  for (; addr < (LispPTR *)bbase + 20; addr++) printf("%16p %8x\n", (void *)addr, *addr);
  printf(". . .\n");

  addr = ((LispPTR *)btrailer) - 20;
  for (; addr < (LispPTR *)btrailer; addr++) printf("%16p %8x\n", (void *)addr, *addr);
  printf("%16p %8x <- array trailer\n", (void *)addr, *addr);
  addr++;
  for (; addr < (LispPTR *)btrailer + 20; addr++) printf("%16p %8x\n", (void *)addr, *addr);
}